

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O2

void Aig_ManUpdateReverseLevel(Aig_Man_t *p,Aig_Obj_t *pObjNew)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Vec_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pObj;
  
  if (p->vLevelR == (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevelR != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                  ,0xfb,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  if (0xfffffffd < (*(uint *)&pObjNew->field_0x18 & 7) - 7) {
    if (p->vLevels == (Vec_Vec_t *)0x0) {
      iVar1 = Aig_ManLevels(p);
      pVVar4 = Vec_VecAlloc(iVar1 + 8);
      p->vLevels = pVVar4;
    }
    iVar1 = Aig_ObjReverseLevel(p,pObjNew);
    iVar2 = Aig_ObjReverseLevelNew(p,pObjNew);
    if (iVar1 != iVar2) {
      Vec_VecClear(p->vLevels);
      Vec_VecPush(p->vLevels,iVar1,pObjNew);
      pObjNew->field_0x18 = pObjNew->field_0x18 | 0x10;
      for (; pVVar4 = p->vLevels, iVar1 < pVVar4->nSize; iVar1 = iVar1 + 1) {
        iVar2 = 0;
        while( true ) {
          pVVar5 = Vec_VecEntry(pVVar4,iVar1);
          if (pVVar5->nSize <= iVar2) break;
          pVVar5 = Vec_VecEntry(p->vLevels,iVar1);
          pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,iVar2);
          pAVar6->field_0x18 = pAVar6->field_0x18 & 0xef;
          iVar3 = Aig_ObjReverseLevel(p,pAVar6);
          if (iVar3 != iVar1) {
            __assert_fail("LevelOld == Lev",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                          ,0x10f,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
          }
          iVar3 = Aig_ObjReverseLevelNew(p,pAVar6);
          Aig_ObjSetReverseLevel(p,pAVar6,iVar3);
          iVar3 = Aig_ObjReverseLevel(p,pAVar6);
          if (iVar3 != iVar1) {
            pObj = (Aig_Obj_t *)((ulong)pAVar6->pFanin0 & 0xfffffffffffffffe);
            if (((*(ulong *)&pObj->field_0x18 & 0x10) == 0) &&
               (((uint)*(ulong *)&pObj->field_0x18 & 7) - 5 < 2)) {
              iVar3 = Aig_ObjReverseLevel(p,pObj);
              if (iVar3 < iVar1) {
                __assert_fail("LevFanin >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                              ,0x119,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
              }
              Vec_VecPush(p->vLevels,iVar3,pObj);
              pObj->field_0x18 = pObj->field_0x18 | 0x10;
            }
            pAVar6 = (Aig_Obj_t *)((ulong)pAVar6->pFanin1 & 0xfffffffffffffffe);
            if (((*(ulong *)&pAVar6->field_0x18 & 0x10) == 0) &&
               (((uint)*(ulong *)&pAVar6->field_0x18 & 7) - 5 < 2)) {
              iVar3 = Aig_ObjReverseLevel(p,pAVar6);
              if (iVar3 < iVar1) {
                __assert_fail("LevFanin >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                              ,0x121,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
              }
              Vec_VecPush(p->vLevels,iVar3,pAVar6);
              pAVar6->field_0x18 = pAVar6->field_0x18 | 0x10;
            }
          }
          iVar2 = iVar2 + 1;
          pVVar4 = p->vLevels;
        }
      }
    }
    return;
  }
  __assert_fail("Aig_ObjIsNode(pObjNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                ,0xfc,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ManUpdateReverseLevel( Aig_Man_t * p, Aig_Obj_t * pObjNew )
{
    Aig_Obj_t * pFanin, * pTemp;
    int LevelOld, LevFanin, Lev, k;
    assert( p->vLevelR != NULL );
    assert( Aig_ObjIsNode(pObjNew) );
    // allocate level if needed
    if ( p->vLevels == NULL )
        p->vLevels = Vec_VecAlloc( Aig_ManLevels(p) + 8 );
    // check if level has changed
    LevelOld = Aig_ObjReverseLevel(p, pObjNew);
    if ( LevelOld == Aig_ObjReverseLevelNew(p, pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( p->vLevels );
    Vec_VecPush( p->vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Aig_Obj_t *, p->vLevels, pTemp, Lev, k, LevelOld )
    {
        pTemp->fMarkA = 0;
        LevelOld = Aig_ObjReverseLevel(p, pTemp); 
        assert( LevelOld == Lev );
        Aig_ObjSetReverseLevel( p, pTemp, Aig_ObjReverseLevelNew(p, pTemp) );
        // if the level did not change, to need to check the fanout levels
        if ( Aig_ObjReverseLevel(p, pTemp) == Lev )
            continue;
        // schedule fanins for level update
        pFanin = Aig_ObjFanin0(pTemp);
        if ( Aig_ObjIsNode(pFanin) && !pFanin->fMarkA )
        {
            LevFanin = Aig_ObjReverseLevel( p, pFanin );
            assert( LevFanin >= Lev );
            Vec_VecPush( p->vLevels, LevFanin, pFanin );
            pFanin->fMarkA = 1;
        }
        pFanin = Aig_ObjFanin1(pTemp);
        if ( Aig_ObjIsNode(pFanin) && !pFanin->fMarkA )
        {
            LevFanin = Aig_ObjReverseLevel( p, pFanin );
            assert( LevFanin >= Lev );
            Vec_VecPush( p->vLevels, LevFanin, pFanin );
            pFanin->fMarkA = 1;
        }
    }
}